

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
          (void)

{
  bool bVar1;
  long in_RCX;
  byte in_R9B;
  xml_node_struct *cur;
  axis_t axis;
  xpath_allocator *in_stack_000000d0;
  xml_node_struct *in_stack_000000d8;
  xpath_node_set_raw *in_stack_000000e0;
  xpath_ast_node *in_stack_000000e8;
  long local_40;
  
  local_40 = in_RCX;
  do {
    if (local_40 == 0) {
      return;
    }
    if (*(long *)(local_40 + 0x20) == 0) {
      while (*(long *)(local_40 + 0x30) == 0) {
        local_40 = *(long *)(local_40 + 0x18);
        if (local_40 == 0) {
          return;
        }
      }
      local_40 = *(long *)(local_40 + 0x30);
    }
    else {
      local_40 = *(long *)(local_40 + 0x20);
    }
    bVar1 = step_push(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  } while ((bVar1 & in_R9B & 1) == 0);
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, xml_attribute_struct* a, xml_node_struct* p, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;

			switch (axis)
			{
			case axis_ancestor:
			case axis_ancestor_or_self:
			{
				if (axis == axis_ancestor_or_self && _test == nodetest_type_node) // reject attributes based on principal node type test
					if (step_push(ns, a, p, alloc) & once)
						return;

				xml_node_struct* cur = p;

				while (cur)
				{
					if (step_push(ns, cur, alloc) & once)
						return;

					cur = cur->parent;
				}

				break;
			}

			case axis_descendant_or_self:
			case axis_self:
			{
				if (_test == nodetest_type_node) // reject attributes based on principal node type test
					step_push(ns, a, p, alloc);

				break;
			}

			case axis_following:
			{
				xml_node_struct* cur = p;

				while (cur)
				{
					if (cur->first_child)
						cur = cur->first_child;
					else
					{
						while (!cur->next_sibling)
						{
							cur = cur->parent;

							if (!cur) return;
						}

						cur = cur->next_sibling;
					}

					if (step_push(ns, cur, alloc) & once)
						return;
				}

				break;
			}

			case axis_parent:
			{
				step_push(ns, p, alloc);

				break;
			}

			case axis_preceding:
			{
				// preceding:: axis does not include attribute nodes and attribute ancestors (they are the same as parent's ancestors), so we can reuse node preceding
				step_fill(ns, p, alloc, once, v);
				break;
			}

			default:
				assert(false && "Unimplemented axis"); // unreachable
			}
		}